

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::SSARewriter::AddPhiOperands(SSARewriter *this,PhiCandidate *phi_candidate)

{
  iterator *piVar1;
  pointer *pppPVar2;
  uint uVar3;
  IRContext *pIVar4;
  CFG *this_00;
  Instruction *this_01;
  pointer puVar5;
  BasicBlock *bb;
  iterator iVar6;
  _Elt_pointer ppPVar7;
  iterator __position;
  uint32_t uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  mapped_type *ppBVar10;
  size_type sVar11;
  ulong uVar12;
  ulong extraout_RAX;
  PhiCandidate *pPVar13;
  pointer puVar14;
  uint32_t arg_id;
  PhiCandidate *local_50;
  uint local_48;
  uint local_44;
  BasicBlock *local_40;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_38;
  
  local_50 = phi_candidate;
  if ((phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("phi_candidate->phi_args().size() == 0 && \"Phi candidate already has arguments\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                  ,0xa7,"uint32_t spvtools::opt::SSARewriter::AddPhiOperands(PhiCandidate *)");
  }
  pIVar4 = (this->pass_->super_Pass).context_;
  if ((pIVar4->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar4);
  }
  this_00 = (pIVar4->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  this_01 = (local_50->bb_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  if (this_01->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  pvVar9 = CFG::preds(this_00,uVar8);
  puVar14 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar5 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar14 != puVar5) {
    local_38 = &(this->sealed_blocks_)._M_h;
    local_48 = 0;
    do {
      uVar3 = *puVar14;
      pIVar4 = (this->pass_->super_Pass).context_;
      if ((pIVar4->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar4);
      }
      local_40 = (BasicBlock *)CONCAT44(local_40._4_4_,uVar3);
      ppBVar10 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&((pIVar4->cfg_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                           .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->
                          id2block_,(key_type *)&local_40);
      bb = *ppBVar10;
      local_40 = bb;
      sVar11 = std::
               _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(local_38,&local_40);
      if (sVar11 == 0) {
        uVar12 = 0;
      }
      else {
        uVar8 = GetReachingDef(this,local_50->var_id_,bb);
        uVar12 = (ulong)uVar8;
      }
      local_44 = (uint)uVar12;
      iVar6._M_current =
           (local_50->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (local_50->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_50->phi_args_,iVar6,
                   &local_44);
        uVar12 = extraout_RAX;
      }
      else {
        *iVar6._M_current = local_44;
        (local_50->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      if (local_44 == 0) {
        local_48 = (uint)CONCAT71((int7)(uVar12 >> 8),1);
      }
      else {
        pPVar13 = GetPhiCandidate(this,local_44);
        if ((pPVar13 != (PhiCandidate *)0x0) && (pPVar13 != local_50)) {
          local_40 = (BasicBlock *)CONCAT44(local_40._4_4_,local_50->result_id_);
          iVar6._M_current =
               (pPVar13->users_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (pPVar13->users_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar13->users_,iVar6,
                       (uint *)&local_40);
          }
          else {
            *iVar6._M_current = local_50->result_id_;
            (pPVar13->users_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar5);
    if ((local_48 & 1) != 0) {
      local_50->is_complete_ = false;
      ppPVar7 = (this->incomplete_phis_).c.
                super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppPVar7 ==
          (this->incomplete_phis_).c.
          super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
        ::_M_push_back_aux<spvtools::opt::SSARewriter::PhiCandidate*const&>
                  ((deque<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
                    *)&this->incomplete_phis_,&local_50);
      }
      else {
        *ppPVar7 = local_50;
        piVar1 = &(this->incomplete_phis_).c.
                  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      return local_50->result_id_;
    }
  }
  uVar8 = TryRemoveTrivialPhi(this,local_50);
  if (uVar8 == local_50->result_id_) {
    local_50->is_complete_ = true;
    __position._M_current =
         (this->phis_to_generate_).
         super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->phis_to_generate_).
        super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
      ::_M_realloc_insert<spvtools::opt::SSARewriter::PhiCandidate*const&>
                ((vector<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>
                  *)&this->phis_to_generate_,__position,&local_50);
    }
    else {
      *__position._M_current = local_50;
      pppPVar2 = &(this->phis_to_generate_).
                  super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppPVar2 = *pppPVar2 + 1;
    }
  }
  return uVar8;
}

Assistant:

uint32_t SSARewriter::AddPhiOperands(PhiCandidate* phi_candidate) {
  assert(phi_candidate->phi_args().size() == 0 &&
         "Phi candidate already has arguments");

  bool found_0_arg = false;
  for (uint32_t pred : pass_->cfg()->preds(phi_candidate->bb()->id())) {
    BasicBlock* pred_bb = pass_->cfg()->block(pred);

    // If |pred_bb| is not sealed, use %0 to indicate that
    // |phi_candidate| needs to be completed after the whole CFG has
    // been processed.
    //
    // Note that we cannot call GetReachingDef() in these cases
    // because this would generate an empty Phi candidate in
    // |pred_bb|.  When |pred_bb| is later processed, a new definition
    // for |phi_candidate->var_id_| will be lost because
    // |phi_candidate| will still be reached by the empty Phi.
    //
    // Consider:
    //
    //       BB %23:
    //           %38 = Phi[%i](%int_0[%1], %39[%25])
    //
    //           ...
    //
    //       BB %25: [Starts unsealed]
    //       %39 = Phi[%i]()
    //       %34 = ...
    //       OpStore %i %34    -> Currdef(%i) at %25 is %34
    //       OpBranch %23
    //
    // When we first create the Phi in %38, we add an operandless Phi in
    // %39 to hold the unknown reaching def for %i.
    //
    // But then, when we go to complete %39 at the end.  The reaching def
    // for %i in %25's predecessor is %38 itself.  So we miss the fact
    // that %25 has a def for %i that should be used.
    //
    // By making the argument %0, we make |phi_candidate| incomplete,
    // which will cause it to be completed after the whole CFG has
    // been scanned.
    uint32_t arg_id = IsBlockSealed(pred_bb)
                          ? GetReachingDef(phi_candidate->var_id(), pred_bb)
                          : 0;
    phi_candidate->phi_args().push_back(arg_id);

    if (arg_id == 0) {
      found_0_arg = true;
    } else {
      // If this argument is another Phi candidate, add |phi_candidate| to the
      // list of users for the defining Phi.
      PhiCandidate* defining_phi = GetPhiCandidate(arg_id);
      if (defining_phi && defining_phi != phi_candidate) {
        defining_phi->AddUser(phi_candidate->result_id());
      }
    }
  }

  // If we could not fill-in all the arguments of this Phi, mark it incomplete
  // so it gets completed after the whole CFG has been processed.
  if (found_0_arg) {
    phi_candidate->MarkIncomplete();
    incomplete_phis_.push(phi_candidate);
    return phi_candidate->result_id();
  }

  // Try to remove |phi_candidate|, if it's trivial.
  uint32_t repl_id = TryRemoveTrivialPhi(phi_candidate);
  if (repl_id == phi_candidate->result_id()) {
    // |phi_candidate| is complete and not trivial.  Add it to the
    // list of Phi candidates to generate.
    phi_candidate->MarkComplete();
    phis_to_generate_.push_back(phi_candidate);
  }

  return repl_id;
}